

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp,stbi__result_info *ri)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  stbi_uc sVar5;
  stbi_uc sVar6;
  int iVar7;
  int iVar8;
  undefined7 extraout_var;
  uchar *puVar9;
  char *pcVar10;
  long lVar11;
  stbi_uc *psVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint y;
  uint uVar17;
  long lVar18;
  uint uVar19;
  uchar *puVar20;
  long in_FS_OFFSET;
  stbi_uc value [4];
  int left;
  stbi__pic_packet packets [10];
  stbi_uc local_bc [4];
  ulong local_b8;
  ulong local_b0;
  int local_a4;
  ulong local_a0;
  uchar *local_98;
  ulong local_90;
  int local_88;
  uint local_84;
  uint *local_80;
  uint *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  stbi_uc asStack_58 [2];
  byte local_56 [38];
  
  iVar15 = 0x5c;
  local_a4 = req_comp;
  local_80 = (uint *)px;
  local_78 = (uint *)py;
  do {
    stbi__get8(s);
    iVar15 = iVar15 + -1;
  } while (iVar15 != 0);
  bVar3 = stbi__get8(s);
  bVar4 = stbi__get8(s);
  sVar5 = stbi__get8(s);
  uVar13 = CONCAT71(extraout_var,sVar5) & 0xffffffff;
  sVar6 = stbi__get8(s);
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00108946:
    if (s->img_buffer_end <= s->img_buffer) {
LAB_00108e45:
      pcVar10 = "bad file";
      goto LAB_00108e6e;
    }
  }
  else {
    iVar15 = (*(s->io).eof)(s->io_user_data);
    if (iVar15 != 0) {
      if (s->read_from_callbacks != 0) goto LAB_00108946;
      goto LAB_00108e45;
    }
  }
  local_90 = (ulong)bVar3 << 8;
  local_b0 = (ulong)bVar4;
  uVar16 = (int)local_90 + (uint)bVar4;
  y = (uint)CONCAT11(sVar5,sVar6);
  if ((y == 0) || ((uVar16 <= (uint)(0x7fffffff / (ulong)y) && (y * uVar16 < 0x20000000)))) {
    stbi__get32be(s);
    stbi__get8(s);
    stbi__get8(s);
    stbi__get8(s);
    stbi__get8(s);
    uVar19 = 0;
    puVar9 = (uchar *)stbi__malloc_mad3(uVar16,y,4,0);
    if (puVar9 != (uchar *)0x0) {
      local_b8 = (ulong)uVar16;
      memset(puVar9,0xff,(ulong)(uVar16 * y * 4));
      bVar3 = 0;
      do {
        if (uVar19 == 10) {
          pcVar10 = "bad format";
LAB_00108ab0:
          *(char **)(in_FS_OFFSET + -0x20) = pcVar10;
          bVar2 = false;
        }
        else {
          lVar11 = (long)(int)uVar19;
          uVar19 = uVar19 + 1;
          lVar11 = lVar11 * 3;
          bVar4 = stbi__get8(s);
          uVar13 = (ulong)bVar4;
          sVar5 = stbi__get8(s);
          asStack_58[lVar11] = sVar5;
          sVar6 = stbi__get8(s);
          asStack_58[lVar11 + 1] = sVar6;
          bVar4 = stbi__get8(s);
          asStack_58[lVar11 + 2] = bVar4;
          bVar3 = bVar3 | bVar4;
          if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00108a88:
            if (s->img_buffer_end <= s->img_buffer) {
LAB_00108aa9:
              pcVar10 = "bad file";
              goto LAB_00108ab0;
            }
          }
          else {
            iVar15 = (*(s->io).eof)(s->io_user_data);
            if (iVar15 != 0) {
              if (s->read_from_callbacks != 0) goto LAB_00108a88;
              goto LAB_00108aa9;
            }
          }
          bVar2 = true;
          pcVar10 = "bad format";
          if (sVar5 != '\b') goto LAB_00108ab0;
        }
        iVar15 = (int)uVar13;
        bVar1 = true;
        if (!bVar2) goto LAB_00108ec2;
      } while (iVar15 != 0);
      iVar15 = 4 - (uint)((bVar3 & 0x10) == 0);
      if (comp != (int *)0x0) {
        *comp = iVar15;
      }
      if (y == 0) {
        bVar1 = false;
      }
      else {
        local_88 = (int)local_b8 * 4;
        local_70 = (ulong)y;
        local_68 = (ulong)uVar19;
        local_90 = (ulong)(uint)((int)local_90 + (int)local_b0);
        local_a0 = 0;
        do {
          if (0 < (int)uVar19) {
            local_98 = puVar9 + local_88 * (int)local_a0;
            uVar13 = 0;
            do {
              lVar11 = uVar13 * 3;
              sVar5 = asStack_58[lVar11 + 1];
              local_60 = uVar13;
              if (sVar5 == '\0') {
                if ((int)local_b8 != 0) {
                  bVar3 = asStack_58[lVar11 + 2];
                  uVar13 = local_90 & 0xffffffff;
                  puVar20 = local_98;
                  do {
                    psVar12 = stbi__readval(s,(uint)bVar3,puVar20);
                    if (psVar12 == (stbi_uc *)0x0) goto LAB_00108ec2;
                    puVar20 = puVar20 + 4;
                    uVar16 = (int)uVar13 - 1;
                    uVar13 = (ulong)uVar16;
                  } while (uVar16 != 0);
                }
              }
              else {
                uVar13 = local_b8 & 0xffffffff;
                puVar20 = local_98;
                if (sVar5 == '\x01') {
                  while (iVar7 = (int)uVar13, 0 < iVar7) {
                    bVar3 = stbi__get8(s);
                    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00108d18:
                      if (s->img_buffer < s->img_buffer_end) goto LAB_00108d28;
LAB_00108d8c:
                      *(char **)(in_FS_OFFSET + -0x20) = "bad file";
LAB_00108d9c:
                      bVar2 = false;
                    }
                    else {
                      iVar8 = (*(s->io).eof)(s->io_user_data);
                      if (iVar8 != 0) {
                        if (s->read_from_callbacks != 0) goto LAB_00108d18;
                        goto LAB_00108d8c;
                      }
LAB_00108d28:
                      psVar12 = stbi__readval(s,(uint)asStack_58[lVar11 + 2],local_bc);
                      if (psVar12 == (stbi_uc *)0x0) goto LAB_00108d9c;
                      if (iVar7 < (int)(uint)bVar3) {
                        bVar3 = (byte)uVar13;
                      }
                      if (bVar3 != 0) {
                        uVar16 = 0;
                        do {
                          bVar4 = asStack_58[lVar11 + 2];
                          uVar14 = 0x80;
                          lVar18 = 0;
                          do {
                            if ((uVar14 & bVar4) != 0) {
                              puVar20[lVar18] = local_bc[lVar18];
                            }
                            lVar18 = lVar18 + 1;
                            uVar14 = uVar14 >> 1;
                          } while (lVar18 != 4);
                          uVar16 = uVar16 + 1;
                          puVar20 = puVar20 + 4;
                        } while (uVar16 != bVar3);
                      }
                      uVar13 = (ulong)(iVar7 - (uint)bVar3);
                      bVar2 = true;
                    }
                    if (!bVar2) goto LAB_00108ec2;
                  }
                }
                else {
                  local_b0 = CONCAT44(local_b0._4_4_,(int)local_b8);
                  if (sVar5 != '\x02') {
                    *(char **)(in_FS_OFFSET + -0x20) = "bad format";
                    goto LAB_00108ec2;
                  }
                  while (0 < (int)local_b0) {
                    bVar3 = stbi__get8(s);
                    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00108bdd:
                      if (s->img_buffer_end <= s->img_buffer) goto LAB_00108c2b;
LAB_00108bed:
                      uVar16 = (uint)bVar3;
                      if ((char)bVar3 < '\0') {
                        if (uVar16 == 0x80) {
                          sVar5 = stbi__get8(s);
                          sVar6 = stbi__get8(s);
                          uVar16 = (uint)CONCAT11(sVar5,sVar6);
                        }
                        else {
                          uVar16 = uVar16 - 0x7f;
                        }
                        if ((int)local_b0 < (int)uVar16) {
                          *(char **)(in_FS_OFFSET + -0x20) = "bad file";
LAB_00108cdb:
                          bVar2 = false;
                        }
                        else {
                          psVar12 = stbi__readval(s,(uint)asStack_58[lVar11 + 2],local_bc);
                          if (psVar12 == (stbi_uc *)0x0) goto LAB_00108cdb;
                          bVar2 = true;
                          if (0 < (int)uVar16) {
                            uVar14 = 0;
                            do {
                              bVar3 = asStack_58[lVar11 + 2];
                              uVar17 = 0x80;
                              lVar18 = 0;
                              do {
                                if ((uVar17 & bVar3) != 0) {
                                  puVar20[lVar18] = local_bc[lVar18];
                                }
                                lVar18 = lVar18 + 1;
                                uVar17 = uVar17 >> 1;
                              } while (lVar18 != 4);
                              uVar14 = uVar14 + 1;
                              puVar20 = puVar20 + 4;
                            } while (uVar14 != uVar16);
                          }
                        }
                        if (bVar2) goto LAB_00108ce5;
                        goto LAB_00108c3b;
                      }
                      if ((int)local_b0 <= (int)uVar16) goto LAB_00108c2b;
                      local_84 = bVar3 + 1;
                      iVar7 = uVar16 + 1;
                      do {
                        psVar12 = stbi__readval(s,(uint)asStack_58[lVar11 + 2],puVar20);
                        if (psVar12 == (stbi_uc *)0x0) goto LAB_00108c3b;
                        puVar20 = puVar20 + 4;
                        iVar7 = iVar7 + -1;
                        uVar16 = local_84;
                      } while (iVar7 != 0);
LAB_00108ce5:
                      local_b0 = CONCAT44(local_b0._4_4_,(int)local_b0 - uVar16);
                      bVar2 = true;
                    }
                    else {
                      iVar7 = (*(s->io).eof)(s->io_user_data);
                      if (iVar7 == 0) goto LAB_00108bed;
                      if (s->read_from_callbacks != 0) goto LAB_00108bdd;
LAB_00108c2b:
                      *(char **)(in_FS_OFFSET + -0x20) = "bad file";
LAB_00108c3b:
                      bVar2 = false;
                    }
                    if (!bVar2) goto LAB_00108ec2;
                  }
                }
              }
              uVar13 = local_60 + 1;
            } while (uVar13 != local_68);
          }
          local_a0 = local_a0 + 1;
        } while (local_a0 != local_70);
        bVar1 = false;
      }
LAB_00108ec2:
      if (bVar1) {
        free(puVar9);
        puVar9 = (uchar *)0x0;
      }
      *local_80 = (uint)local_b8;
      *local_78 = y;
      if (local_a4 != 0) {
        iVar15 = local_a4;
      }
      if (local_a4 == 0 && comp != (int *)0x0) {
        iVar15 = *comp;
      }
      puVar9 = stbi__convert_format(puVar9,4,iVar15,(uint)local_b8,y);
      return puVar9;
    }
    pcVar10 = "outofmem";
  }
  else {
    pcVar10 = "too large";
  }
LAB_00108e6e:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar10;
  return (void *)0x0;
}

Assistant:

static void *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp, stbi__result_info *ri)
{
   stbi_uc *result;
   int i, x,y, internal_comp;
   STBI_NOTUSED(ri);

   if (!comp) comp = &internal_comp;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);

   if (y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if (!stbi__mad3sizes_valid(x, y, 4, 0)) return stbi__errpuc("too large", "PIC image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc_mad3(x, y, 4, 0);
   if (!result) return stbi__errpuc("outofmem", "Out of memory");
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}